

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O2

void locale_init(UErrorCode *status)

{
  undefined8 *puVar1;
  size_t in_RSI;
  Locale *this;
  long lVar2;
  Locale local_110;
  
  puVar1 = (undefined8 *)icu_63::UMemory::operator_new__((UMemory *)0x10a8,in_RSI);
  if (puVar1 == (undefined8 *)0x0) {
    icu_63::gLocaleCache = (Locale *)0x0;
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    *puVar1 = 0x13;
    lVar2 = 0;
    this = (Locale *)(puVar1 + 1);
    do {
      icu_63::Locale::Locale(this);
      lVar2 = lVar2 + -0xe0;
      this = this + 1;
    } while (lVar2 != -0x10a0);
    icu_63::gLocaleCache = (Locale *)(puVar1 + 1);
    ucln_common_registerCleanup_63(UCLN_COMMON_LOCALE,locale_cleanup);
    icu_63::Locale::Locale(&local_110,"",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0x12,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"en",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"fr",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 1,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"de",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 2,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"it",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 3,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"ja",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 4,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"ko",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 5,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"zh",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 6,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"fr","FR",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 7,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"de","DE",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 8,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"it","IT",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 9,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"ja","JP",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 10,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"ko","KR",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0xb,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"zh","CN",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0xc,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"zh","TW",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0xd,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"en","GB",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0xe,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"en","US",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0xf,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"en","CA",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0x10,&local_110);
    icu_63::Locale::~Locale(&local_110);
    icu_63::Locale::Locale(&local_110,"fr","CA",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0x11,&local_110);
    icu_63::Locale::~Locale(&local_110);
  }
  return;
}

Assistant:

static void U_CALLCONV locale_init(UErrorCode &status) {
    U_NAMESPACE_USE

    U_ASSERT(gLocaleCache == NULL);
    gLocaleCache = new Locale[(int)eMAX_LOCALES];
    if (gLocaleCache == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    ucln_common_registerCleanup(UCLN_COMMON_LOCALE, locale_cleanup);
    gLocaleCache[eROOT]          = Locale("");
    gLocaleCache[eENGLISH]       = Locale("en");
    gLocaleCache[eFRENCH]        = Locale("fr");
    gLocaleCache[eGERMAN]        = Locale("de");
    gLocaleCache[eITALIAN]       = Locale("it");
    gLocaleCache[eJAPANESE]      = Locale("ja");
    gLocaleCache[eKOREAN]        = Locale("ko");
    gLocaleCache[eCHINESE]       = Locale("zh");
    gLocaleCache[eFRANCE]        = Locale("fr", "FR");
    gLocaleCache[eGERMANY]       = Locale("de", "DE");
    gLocaleCache[eITALY]         = Locale("it", "IT");
    gLocaleCache[eJAPAN]         = Locale("ja", "JP");
    gLocaleCache[eKOREA]         = Locale("ko", "KR");
    gLocaleCache[eCHINA]         = Locale("zh", "CN");
    gLocaleCache[eTAIWAN]        = Locale("zh", "TW");
    gLocaleCache[eUK]            = Locale("en", "GB");
    gLocaleCache[eUS]            = Locale("en", "US");
    gLocaleCache[eCANADA]        = Locale("en", "CA");
    gLocaleCache[eCANADA_FRENCH] = Locale("fr", "CA");
}